

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trackableobject.h
# Opt level: O0

void __thiscall Trackableobject::append(Trackableobject *this,centroid c,rect *r)

{
  size_type sVar1;
  size_type sVar2;
  value_type *__x;
  queue<std::pair<float,_float>,_std::deque<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>
  *this_00;
  int *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  float aY;
  float aX;
  float sY_1;
  float sX_1;
  float sY;
  float sX;
  value_type *in_stack_ffffffffffffff68;
  pair<centroid,_rect> *in_stack_ffffffffffffff70;
  pair<float,_float> local_78;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  rect local_60;
  pair<float,_float> local_50;
  pair<float,_float> local_48;
  pair<float,_float> local_40;
  float local_38;
  float local_34 [11];
  undefined8 local_8;
  
  local_8 = in_RSI;
  sVar1 = std::
          queue<std::pair<centroid,_rect>,_std::deque<std::pair<centroid,_rect>,_std::allocator<std::pair<centroid,_rect>_>_>_>
          ::size((queue<std::pair<centroid,_rect>,_std::deque<std::pair<centroid,_rect>,_std::allocator<std::pair<centroid,_rect>_>_>_>
                  *)0x129a66);
  if (sVar1 == (long)*(int *)(in_RDI + 0x110)) {
    std::
    queue<std::pair<centroid,_rect>,_std::deque<std::pair<centroid,_rect>,_std::allocator<std::pair<centroid,_rect>_>_>_>
    ::pop((queue<std::pair<centroid,_rect>,_std::deque<std::pair<centroid,_rect>,_std::allocator<std::pair<centroid,_rect>_>_>_>
           *)0x129a81);
  }
  sVar2 = std::
          queue<std::pair<float,_float>,_std::deque<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>
          ::size((queue<std::pair<float,_float>,_std::deque<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>
                  *)0x129a8f);
  if (sVar2 == (long)*(int *)(in_RDI + 0x110)) {
    std::
    queue<std::pair<float,_float>,_std::deque<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>
    ::pop((queue<std::pair<float,_float>,_std::deque<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>
           *)0x129aae);
  }
  sVar2 = std::
          queue<std::pair<float,_float>,_std::deque<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>
          ::size((queue<std::pair<float,_float>,_std::deque<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>
                  *)0x129abf);
  if (sVar2 == (long)*(int *)(in_RDI + 0x110)) {
    std::
    queue<std::pair<float,_float>,_std::deque<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>
    ::pop((queue<std::pair<float,_float>,_std::deque<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>
           *)0x129ae1);
  }
  std::pair<centroid,_rect>::pair<centroid_&,_rect_&,_true>
            (in_stack_ffffffffffffff70,&in_stack_ffffffffffffff68->first,(rect *)0x129af8);
  std::
  queue<std::pair<centroid,_rect>,_std::deque<std::pair<centroid,_rect>,_std::allocator<std::pair<centroid,_rect>_>_>_>
  ::push((queue<std::pair<centroid,_rect>,_std::deque<std::pair<centroid,_rect>,_std::allocator<std::pair<centroid,_rect>_>_>_>
          *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  local_34[0] = (float)(int)local_8 - *(float *)(in_RDI + 0x100);
  local_38 = (float)local_8._4_4_ - *(float *)(in_RDI + 0x104);
  __x = (value_type *)(in_RDI + 0x50);
  std::pair<float,_float>::pair<float_&,_float_&,_true>(&local_40,local_34,&local_38);
  std::
  queue<std::pair<float,_float>,_std::deque<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>
  ::push((queue<std::pair<float,_float>,_std::deque<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>
          *)in_stack_ffffffffffffff70,__x);
  std::pair<float,_float>::pair<int_&,_int_&,_true>
            (&local_48,(int *)&local_8,(int *)((long)&local_8 + 4));
  std::pair<float,_float>::operator=((pair<float,_float> *)(in_RDI + 0x100),&local_48);
  std::pair<float,_float>::pair<float_&,_float_&,_true>(&local_50,local_34,&local_38);
  std::pair<float,_float>::operator=((pair<float,_float> *)(in_RDI + 0x108),&local_50);
  rect::rect(&local_60,(int)((float)*in_RDX + local_34[0]),(int)((float)in_RDX[1] + local_38),
             (int)((float)in_RDX[2] + local_34[0]),(int)((float)in_RDX[3] + local_38));
  *(undefined8 *)(in_RDI + 0xf0) = local_60._0_8_;
  *(undefined8 *)(in_RDI + 0xf8) = local_60._8_8_;
  local_64 = (float)(int)local_8 - *(float *)(in_RDI + 0x100);
  local_68 = (float)local_8._4_4_ - *(float *)(in_RDI + 0x104);
  local_6c = local_64 - *(float *)(in_RDI + 0x108);
  local_70 = local_68 - *(float *)(in_RDI + 0x10c);
  this_00 = (queue<std::pair<float,_float>,_std::deque<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>
             *)(in_RDI + 0xa0);
  std::pair<float,_float>::pair<float_&,_float_&,_true>(&local_78,&local_6c,&local_70);
  std::
  queue<std::pair<float,_float>,_std::deque<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>_>
  ::push(this_00,__x);
  return;
}

Assistant:

void append(centroid c, rect r) {
		if(this->locations.size()==maxRemenbers){
			this->locations.pop();
		}
		if(this->speeds.size()==maxRemenbers){
			this->speeds.pop();
		}
		if(this->accelerations.size()==maxRemenbers){
			this->accelerations.pop();
		}
		this->locations.push(std::pair<centroid, rect>(c, r));

		// ----------------about the speeds and accelerations------------------------
		{
			//std::pair<float, float> lastlocation = speeds.back();
			float sX = c.x - lastlocation.first;
			float sY = c.y - lastlocation.second;
			
			speeds.push(std::pair<float, float>(sX, sY));

			lastlocation = std::pair<float, float>(c.x, c.y);
			lastspeed = std::pair<float, float>(sX, sY);

			predRect = rect(r.x1 + sX, r.y1 + sY, 
							r.x2 + sX, r.y2 + sY);
		}

		{

			float sX = c.x - lastlocation.first;
			float sY = c.y - lastlocation.second;

			float aX = sX - lastspeed.first;
			float aY = sY - lastspeed.second;

			accelerations.push(std::pair<float, float>(aX, aY));
		}
	}